

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O2

void __thiscall
IRBuilderAsmJs::BuildReg1Uint16x8_1
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot src1RegSlot)

{
  code *pcVar1;
  bool bVar2;
  RegOpnd *this_00;
  StackSym *sym;
  SymOpnd *this_01;
  undefined4 *puVar3;
  undefined6 in_register_00000032;
  Instr *local_40;
  uint32 local_34;
  
  local_34 = offset;
  this_00 = BuildSrcOpnd(this,src1RegSlot,TySimd128U8);
  IR::Opnd::SetValueType(&this_00->super_Opnd,(ValueType)0x4000);
  if ((int)CONCAT62(in_register_00000032,newOpcode) == 0x197) {
    sym = StackSym::NewArgSlotSym((ArgSlot)dstRegSlot,this->m_func,TySimd128U8);
    sym->field_0x19 = sym->field_0x19 | 0x10;
    if ((0xffff < dstRegSlot) || (sym == (StackSym *)0x0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                         ,0x15dd,"((0))","Arg count too big...");
      if (bVar2) {
        *puVar3 = 0;
        Js::Throw::FatalInternalError(-0x7fffbffb);
      }
LAB_004c4aa9:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    this_01 = IR::SymOpnd::New(&sym->super_Sym,TySimd128U4,this->m_func);
    IR::Opnd::SetValueType(&this_01->super_Opnd,(ValueType)0x4000);
    local_40 = IR::Instr::New(ArgOut_A,&this_01->super_Opnd,&this_00->super_Opnd,this->m_func);
    AddInstr(this,local_40,local_34);
    SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Prepend
              (&this->m_argStack->super_SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>,
               &local_40);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x15eb,"((0))","UNREACHED");
    if (!bVar2) goto LAB_004c4aa9;
    *puVar3 = 0;
  }
  return;
}

Assistant:

void IRBuilderAsmJs::BuildReg1Uint16x8_1(Js::OpCodeAsmJs newOpcode, uint32 offset, BUILD_SIMD_ARGS_REG2)
{
    IR::RegOpnd * srcOpnd = BuildSrcOpnd(src1RegSlot, TySimd128U8);
    srcOpnd->SetValueType(ValueType::Simd);

    IR::Instr * instr = nullptr;
    IR::Opnd * dstOpnd = nullptr;
    StackSym * symDst = nullptr;

    if (newOpcode == Js::OpCodeAsmJs::Simd128_I_ArgOut_U8)
    {
        symDst = StackSym::NewArgSlotSym((uint16)dstRegSlot, m_func, TySimd128U8);
        symDst->m_allocated = true;
        if (symDst == nullptr || (uint16)(dstRegSlot) != (dstRegSlot))
        {
            AssertMsg(UNREACHED, "Arg count too big...");
            Fatal();
        }

        dstOpnd = IR::SymOpnd::New(symDst, TySimd128U4, m_func);
        dstOpnd->SetValueType(ValueType::Simd);

        instr = IR::Instr::New(Js::OpCode::ArgOut_A, dstOpnd, srcOpnd, m_func);
        AddInstr(instr, offset);

        m_argStack->Push(instr);
    }
    else
    {
        Assert(UNREACHED);
    }
}